

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O3

RC __thiscall
QL_Manager::JoinRelationWithQO
          (QL_Manager *this,QL_Node **topNode,QO_Rel *qorels,QL_Node *currNode,int qoIdx)

{
  char **ppcVar1;
  int relIndex;
  uint indexNumber;
  RelCatEntry *pRVar2;
  Condition *pCVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  Condition condition;
  Condition *pCVar6;
  RC RVar7;
  QL_NodeRel *this_00;
  int *attrs;
  mapped_type *pmVar8;
  QL_NodeJoin *this_01;
  long lVar9;
  int iVar10;
  int iVar11;
  QL_Node **ppQVar12;
  RelAttr attr;
  int index1;
  int index2;
  int numConds;
  string relString;
  int local_7c;
  QL_Node *local_78;
  int local_70;
  int local_6c;
  QL_Node **local_68;
  long local_60;
  QO_Rel *local_58;
  key_type local_50;
  
  local_60 = (long)qoIdx * 3;
  relIndex = qorels[qoIdx].relIdx;
  local_78 = currNode;
  local_68 = topNode;
  local_58 = qorels;
  this_00 = (QL_NodeRel *)operator_new(0x120);
  QL_NodeRel::QL_NodeRel(this_00,this,this->relEntries + relIndex);
  pRVar2 = this->relEntries;
  attrs = (int *)malloc((long)pRVar2[relIndex].attrCount << 2);
  attrs[0] = 0;
  attrs[1] = 0;
  if (0 < pRVar2[relIndex].attrCount) {
    lVar9 = 0;
    do {
      attrs[lVar9] = 0;
      lVar9 = lVar9 + 1;
    } while (lVar9 < pRVar2[relIndex].attrCount);
  }
  std::__cxx11::string::string((string *)&local_50,pRVar2[relIndex].relName,(allocator *)&local_6c);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::operator[](&this->relToAttrIndex,&local_50);
  pRVar2 = this->relEntries;
  iVar10 = pRVar2[relIndex].attrCount;
  if (0 < iVar10) {
    iVar11 = *pmVar8;
    lVar9 = 0;
    do {
      attrs[lVar9] = iVar11 + (int)lVar9;
      lVar9 = lVar9 + 1;
      iVar10 = pRVar2[relIndex].attrCount;
    } while (lVar9 < iVar10);
  }
  QL_NodeRel::SetUpNode(this_00,attrs,iVar10);
  free(attrs);
  CountNumConditions(this,relIndex,&local_6c);
  this_01 = (QL_NodeJoin *)operator_new(0x70);
  ppQVar12 = local_68;
  QL_NodeJoin::QL_NodeJoin(this_01,this,local_78,(QL_Node *)this_00);
  RVar7 = QL_NodeJoin::SetUpNode(this_01,local_6c);
  if (RVar7 == 0) {
    *ppQVar12 = (QL_Node *)this_01;
    local_78 = (QL_Node *)(long)(&local_58->indexAttr)[local_60];
    if (local_78 != (QL_Node *)0xffffffffffffffff) {
      iVar10 = (&local_58->indexCond)[local_60];
      local_7c = 0;
      local_70 = 0;
      attr.attrName = this->condptr[iVar10].lhsAttr.attrName;
      attr.relName = this->condptr[iVar10].lhsAttr.relName;
      GetAttrCatEntryPos(this,attr,&local_7c);
      iVar11 = 0;
      if (this->condptr[iVar10].bRhsIsAttr != 0) {
        GetAttrCatEntryPos(this,this->condptr[iVar10].rhsAttr,&local_70);
        iVar11 = local_70;
      }
      if (local_7c != (int)local_78) {
        iVar11 = local_7c;
      }
      indexNumber = this->attrEntries[(long)local_78].indexNo;
      ppQVar12 = local_68;
      if (indexNumber != 0xffffffff) {
        if (this->condptr[iVar10].bRhsIsAttr == 0) {
          RVar7 = (*(this_00->super_QL_Node)._vptr_QL_Node[8])
                            (this_00,local_78,(ulong)indexNumber,this->condptr[iVar10].rhsValue.data
                            );
        }
        else {
          RVar7 = QL_NodeJoin::UseIndexJoin(this_01,iVar11,(int)local_78,indexNumber);
        }
        ppQVar12 = local_68;
        if (RVar7 != 0) goto LAB_0010fa40;
      }
    }
    local_7c = 0;
    RVar7 = 0;
    if (0 < this->nConds) {
      do {
        pmVar8 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                 operator[](&this->conditionToRel,&local_7c);
        if (*pmVar8 == relIndex) {
          pCVar3 = this->condptr;
          lVar9 = (long)local_7c;
          pCVar6 = pCVar3 + lVar9;
          uVar4 = pCVar6->op;
          uVar5 = pCVar6->bRhsIsAttr;
          condition.bRhsIsAttr = uVar5;
          condition.op = uVar4;
          ppcVar1 = &pCVar3[lVar9].rhsAttr.attrName;
          condition.lhsAttr = pCVar3[lVar9].lhsAttr;
          condition.rhsAttr.relName = ((RelAttr *)(&pCVar6->op + 2))->relName;
          condition.rhsAttr.attrName = *ppcVar1;
          condition.rhsValue._0_8_ = ppcVar1[1];
          condition.rhsValue.data = pCVar3[lVar9].rhsValue.data;
          RVar7 = QL_Node::AddCondition(*ppQVar12,condition,local_7c);
          if (RVar7 != 0) break;
        }
        local_7c = local_7c + 1;
        RVar7 = 0;
      } while (local_7c < this->nConds);
    }
  }
LAB_0010fa40:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return RVar7;
}

Assistant:

RC QL_Manager::JoinRelationWithQO(QL_Node *&topNode, QO_Rel* qorels, QL_Node *currNode, int qoIdx){
  RC rc = 0;
  int relIndex = qorels[qoIdx].relIdx;
  // create new relation node, providing the relation entry
  QL_NodeRel *relNode = new QL_NodeRel(*this, relEntries + relIndex);

  // Set up the list of indices corresponding to attributes in the relation
  int *attrList = (int *)malloc(relEntries[relIndex].attrCount * sizeof(int));
  memset((void *)attrList, 0, sizeof(attrList));
  for(int i = 0;  i < relEntries[relIndex].attrCount ; i++){
    attrList[i] = 0;
  }
  string relString(relEntries[relIndex].relName);
  int start = relToAttrIndex[relString]; // get the offset of the first attr in this relation
  for(int i = 0;  i < relEntries[relIndex].attrCount ; i++){
    attrList[i] = start + i;
  }
  // Set up the relation node by providing the attribute list and # of attributes
  relNode->SetUpNode(attrList, relEntries[relIndex].attrCount);
  free(attrList);

  // Count the # of conditions associated with this attribute
  int numConds;
  CountNumConditions(relIndex, numConds);

  // create new join node:
  QL_NodeJoin *joinNode = new QL_NodeJoin(*this, *currNode, *relNode);
  if((rc = joinNode->SetUpNode(numConds))) // provide a max count on # of conditions
    return (rc);                           // to add to this join
  topNode = joinNode;

  if(qorels[qoIdx].indexAttr != -1){
    int condIdx = qorels[qoIdx].indexCond;
    int index = qorels[qoIdx].indexAttr;
    int index1 = 0;
    int index2 = 0;
    GetAttrCatEntryPos(condptr[condIdx].lhsAttr, index1);
    if(condptr[condIdx].bRhsIsAttr)
      GetAttrCatEntryPos(condptr[condIdx].rhsAttr, index2);
    int otherAttr;
    if(index1 == index)
      otherAttr = index2;
    else
      otherAttr = index1;
    if((attrEntries[index].indexNo != -1) && !condptr[condIdx].bRhsIsAttr){ // add only if there is an index on this attribute
      //cout << "adding index join on attr " << index; 
      if((rc = relNode->UseIndex(index, attrEntries[index].indexNo, condptr[condIdx].rhsValue.data) ))
        return (rc);
    }
    else if((attrEntries[index].indexNo != -1) && condptr[condIdx].bRhsIsAttr){
      //cout << "adding, lhs attr: " << otherAttr << ", rhsATtr: " << index << endl;
      if((rc = joinNode->UseIndexJoin(otherAttr, index, attrEntries[index].indexNo)))
        return (rc);
    }
  }
  for(int i = 0 ; i < nConds; i++){
    if(conditionToRel[i] == relIndex){
      if((rc = topNode->AddCondition(condptr[i], i) ))
        return (rc);
    }
  }
  return (0);
}